

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O2

void __thiscall
duckdb::UpdateSegment::CleanupUpdateInternal
          (UpdateSegment *this,StorageLockKey *lock,UpdateInfo *info)

{
  idx_t iVar1;
  data_ptr_t pdVar2;
  UndoBufferReference pin;
  UndoBufferPointer prev;
  UndoBufferPointer next;
  UndoBufferReference local_60;
  UndoBufferPointer local_38;
  UndoBufferPointer local_28;
  
  local_38.entry = (info->prev).entry;
  local_38.position = (info->prev).position;
  UndoBufferPointer::Pin(&local_60,&local_38);
  pdVar2 = UndoBufferReference::Ptr(&local_60);
  iVar1 = (info->next).position;
  *(UndoBufferEntry **)(pdVar2 + 0x38) = (info->next).entry;
  *(idx_t *)(pdVar2 + 0x40) = iVar1;
  BufferHandle::~BufferHandle(&local_60.handle);
  if ((info->next).entry != (UndoBufferEntry *)0x0) {
    local_28.entry = (info->next).entry;
    local_28.position = (info->next).position;
    UndoBufferPointer::Pin(&local_60,&local_28);
    pdVar2 = UndoBufferReference::Ptr(&local_60);
    *(UndoBufferEntry **)(pdVar2 + 0x28) = local_38.entry;
    *(idx_t *)(pdVar2 + 0x30) = local_38.position;
    BufferHandle::~BufferHandle(&local_60.handle);
  }
  return;
}

Assistant:

void UpdateSegment::CleanupUpdateInternal(const StorageLockKey &lock, UpdateInfo &info) {
	D_ASSERT(info.HasPrev());
	auto prev = info.prev;
	{
		auto pin = prev.Pin();
		auto &prev_info = UpdateInfo::Get(pin);
		prev_info.next = info.next;
	}
	if (info.HasNext()) {
		auto next = info.next;
		auto next_pin = next.Pin();
		auto &next_info = UpdateInfo::Get(next_pin);
		next_info.prev = prev;
	}
}